

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::LoadedNormalizer2Impl::load
          (LoadedNormalizer2Impl *this,char *packageName,char *name,UErrorCode *errorCode)

{
  UBool UVar1;
  UDataMemory *pUVar2;
  EVP_PKEY_CTX *ctx;
  UCPTrie *pUVar3;
  uint8_t *inSmallFCD;
  uint16_t *inExtraData;
  int32_t nextOffset;
  int32_t offset;
  int32_t indexesLength;
  int32_t *inIndexes;
  uint8_t *inBytes;
  UErrorCode *errorCode_local;
  char *name_local;
  char *packageName_local;
  LoadedNormalizer2Impl *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pUVar2 = udata_openChoice_63(packageName,"nrm",name,isAcceptable,this,errorCode);
    this->memory = pUVar2;
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      ctx = (EVP_PKEY_CTX *)udata_getMemory_63(this->memory);
      if (*(int *)ctx / 4 < 0x13) {
        *errorCode = U_INVALID_FORMAT_ERROR;
      }
      else {
        pUVar3 = ucptrie_openFromBinary_63
                           (UCPTRIE_TYPE_FAST,UCPTRIE_VALUE_BITS_16,ctx + *(int *)ctx,
                            *(int *)(ctx + 4) - *(int *)ctx,(int32_t *)0x0,errorCode);
        this->ownedTrie = pUVar3;
        UVar1 = ::U_FAILURE(*errorCode);
        if (UVar1 == '\0') {
          Normalizer2Impl::init(&this->super_Normalizer2Impl,ctx);
        }
      }
    }
  }
  return;
}

Assistant:

void
LoadedNormalizer2Impl::load(const char *packageName, const char *name, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return;
    }
    memory=udata_openChoice(packageName, "nrm", name, isAcceptable, this, &errorCode);
    if(U_FAILURE(errorCode)) {
        return;
    }
    const uint8_t *inBytes=(const uint8_t *)udata_getMemory(memory);
    const int32_t *inIndexes=(const int32_t *)inBytes;
    int32_t indexesLength=inIndexes[IX_NORM_TRIE_OFFSET]/4;
    if(indexesLength<=IX_MIN_LCCC_CP) {
        errorCode=U_INVALID_FORMAT_ERROR;  // Not enough indexes.
        return;
    }

    int32_t offset=inIndexes[IX_NORM_TRIE_OFFSET];
    int32_t nextOffset=inIndexes[IX_EXTRA_DATA_OFFSET];
    ownedTrie=ucptrie_openFromBinary(UCPTRIE_TYPE_FAST, UCPTRIE_VALUE_BITS_16,
                                     inBytes+offset, nextOffset-offset, NULL,
                                     &errorCode);
    if(U_FAILURE(errorCode)) {
        return;
    }

    offset=nextOffset;
    nextOffset=inIndexes[IX_SMALL_FCD_OFFSET];
    const uint16_t *inExtraData=(const uint16_t *)(inBytes+offset);

    // smallFCD: new in formatVersion 2
    offset=nextOffset;
    const uint8_t *inSmallFCD=inBytes+offset;

    init(inIndexes, ownedTrie, inExtraData, inSmallFCD);
}